

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2lax_loop_shape.cc
# Opt level: O1

Edge * __thiscall S2LaxLoopShape::edge(Edge *__return_storage_ptr__,S2LaxLoopShape *this,int e0)

{
  Vector3<double> *pVVar1;
  VType VVar2;
  int iVar3;
  S2LogMessage SStack_18;
  
  if (e0 < *(int *)&(this->super_S2Shape).field_0xc) {
    iVar3 = 0;
    if (e0 + 1 != *(int *)&(this->super_S2Shape).field_0xc) {
      iVar3 = e0 + 1;
    }
    pVVar1 = (this->vertices_)._M_t.
             super___uniq_ptr_impl<Vector3<double>,_std::default_delete<Vector3<double>[]>_>._M_t.
             super__Tuple_impl<0UL,_Vector3<double>_*,_std::default_delete<Vector3<double>[]>_>.
             super__Head_base<0UL,_Vector3<double>_*,_false>._M_head_impl;
    (__return_storage_ptr__->v0).c_[2] = pVVar1[e0].c_[2];
    VVar2 = pVVar1[e0].c_[1];
    (__return_storage_ptr__->v0).c_[0] = pVVar1[e0].c_[0];
    (__return_storage_ptr__->v0).c_[1] = VVar2;
    VVar2 = pVVar1[iVar3].c_[1];
    (__return_storage_ptr__->v1).c_[0] = pVVar1[iVar3].c_[0];
    (__return_storage_ptr__->v1).c_[1] = VVar2;
    (__return_storage_ptr__->v1).c_[2] = pVVar1[iVar3].c_[2];
    return __return_storage_ptr__;
  }
  S2LogMessage::S2LogMessage
            (&SStack_18,
             "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2lax_loop_shape.cc"
             ,0x38,kFatal,(ostream *)&std::cerr);
  std::__ostream_insert<char,std::char_traits<char>>
            (SStack_18.stream_,"Check failed: (e0) < (num_edges()) ",0x23);
  abort();
}

Assistant:

S2Shape::Edge S2LaxLoopShape::edge(int e0) const {
  S2_DCHECK_LT(e0, num_edges());
  int e1 = e0 + 1;
  if (e1 == num_vertices()) e1 = 0;
  return Edge(vertices_[e0], vertices_[e1]);
}